

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void textsize_cb(Fl_Value_Input *i,void *v)

{
  int iVar1;
  bool bVar2;
  Fl_Widget_Type *q;
  Fl_Type *pFVar3;
  int s;
  Fl_Color c;
  Fl_Font n;
  int local_3c;
  undefined1 local_38 [4];
  undefined1 local_34 [4];
  
  if ((char *)v == "LOAD") {
    iVar1 = (*(current_widget->super_Fl_Type)._vptr_Fl_Type[0x2b])
                      (current_widget,0,local_34,&local_3c,local_38);
    if (iVar1 == 0) {
      Fl_Widget::deactivate((Fl_Widget *)i);
      return;
    }
    Fl_Widget::activate((Fl_Widget *)i);
  }
  else {
    local_3c = (int)(i->super_Fl_Valuator).value_;
    if (local_3c < 1) {
      local_3c = Fl_Widget_Type::default_size;
    }
    if (Fl_Type::first != (Fl_Type *)0x0) {
      bVar2 = true;
      pFVar3 = Fl_Type::first;
      do {
        while ((pFVar3->selected == '\0' ||
               (iVar1 = (*pFVar3->_vptr_Fl_Type[0x17])(pFVar3), iVar1 == 0))) {
          pFVar3 = pFVar3->next;
          if (pFVar3 == (Fl_Type *)0x0) {
            if (bVar2) goto LAB_00185ce5;
            goto LAB_00185cac;
          }
        }
        (*pFVar3->_vptr_Fl_Type[0x2b])(pFVar3,2,local_34,&local_3c,local_38);
        Fl_Widget::redraw((Fl_Widget *)pFVar3[1].prev);
        pFVar3 = pFVar3->next;
        bVar2 = false;
      } while (pFVar3 != (Fl_Type *)0x0);
LAB_00185cac:
      set_modflag(1);
    }
  }
LAB_00185ce5:
  Fl_Valuator::value(&i->super_Fl_Valuator,(double)local_3c);
  return;
}

Assistant:

void textsize_cb(Fl_Value_Input* i, void* v) {
  Fl_Font n; int s; Fl_Color c;
  if (v == LOAD) {
    if (!current_widget->textstuff(0,n,s,c)) {i->deactivate(); return;}
    i->activate();
  } else {
    int mod = 0;
    s = int(i->value());
    if (s <= 0) s = Fl_Widget_Type::default_size;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->textstuff(2,n,s,c);
	q->o->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->value(s);
}